

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall polyscope::render::backend_openGL3_glfw::GLEngine::initialize(GLEngine *this)

{
  int iVar1;
  _func_void_int_char_ptr *cbfun;
  GLFWwindow *pGVar2;
  ostream *poVar3;
  GLubyte *pGVar4;
  long *plVar5;
  GLFrameBuffer *in_RDI;
  GLFrameBuffer *glScreenBuffer;
  int newWindowHeight;
  int newWindowWidth;
  int newBufferHeight;
  int newBufferWidth;
  anon_class_1_0_00000001 error_print_callback;
  GLFWwindow *in_stack_00000320;
  GLFWmonitor *in_stack_00000328;
  char *in_stack_00000330;
  int in_stack_00000338;
  int in_stack_0000033c;
  GLEngine *in_stack_00004160;
  undefined8 in_stack_ffffffffffffff58;
  GLFWwindow *in_stack_ffffffffffffff60;
  GLFrameBuffer *in_stack_ffffffffffffff68;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined1 local_70 [48];
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar8;
  int in_stack_ffffffffffffffc4;
  __0 local_9 [9];
  
  cbfun = initialize()::$_0::operator_cast_to_function_pointer(local_9);
  glfwSetErrorCallback(cbfun);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    in_stack_ffffffffffffff78 = &stack0xffffffffffffffd0;
    std::operator+(in_stack_ffffffffffffff88,(char *)in_RDI);
    exception((string *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  }
  glfwWindowHint((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60);
  glfwWindowHint((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60);
  glfwWindowHint((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60);
  glfwWindowHint((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60);
  glfwWindowHint((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_stack_ffffffffffffff60);
  uVar6 = view::windowWidth;
  uVar7 = view::windowHeight;
  std::__cxx11::string::c_str();
  pGVar2 = glfwCreateWindow(in_stack_0000033c,in_stack_00000338,in_stack_00000330,in_stack_00000328,
                            in_stack_00000320);
  *(GLFWwindow **)&in_RDI[4].super_FrameBuffer.sizeY = pGVar2;
  glfwMakeContextCurrent(in_stack_ffffffffffffff60);
  glfwSetWindowPos(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (int)in_stack_ffffffffffffff58);
  glfwGetFramebufferSize
            ((GLFWwindow *)CONCAT44(uVar7,uVar6),(int *)in_stack_ffffffffffffff68,
             (int *)in_stack_ffffffffffffff60);
  glfwGetWindowSize((GLFWwindow *)CONCAT44(uVar7,uVar6),(int *)in_stack_ffffffffffffff68,
                    (int *)in_stack_ffffffffffffff60);
  view::bufferWidth = in_stack_ffffffffffffffc0;
  view::bufferHeight = local_70._44_4_;
  view::windowWidth = local_70._40_4_;
  view::windowHeight = local_70._36_4_;
  uVar8 = view::bufferWidth;
  (*(in_RDI->super_FrameBuffer)._vptr_FrameBuffer[0x14])(in_RDI,(ulong)view::windowResizable & 1);
  iVar1 = gladLoadGL();
  if (iVar1 == 0) {
    in_stack_ffffffffffffff68 = (GLFrameBuffer *)local_70;
    std::operator+(in_stack_ffffffffffffff88,(char *)in_RDI);
    exception((string *)CONCAT44(in_stack_ffffffffffffffc4,uVar8));
    std::__cxx11::string::~string((string *)local_70);
  }
  if (0 < options::verbosity) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"Backend: openGL3_glfw -- ");
    poVar3 = std::operator<<(poVar3,"Loaded openGL version: ");
    pGVar4 = (*glad_glGetString)(0x1f02);
    poVar3 = std::operator<<(poVar3,pGVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  plVar5 = (long *)operator_new(0xb0);
  GLFrameBuffer::GLFrameBuffer
            (in_RDI,(uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),(uint)in_stack_ffffffffffffff78
             ,SUB41((uint)uVar7 >> 0x18,0));
  std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<polyscope::render::backend_openGL3_glfw::GLFrameBuffer>
            ((__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(uVar7,uVar6),in_stack_ffffffffffffff68);
  (**(code **)(*plVar5 + 0x10))();
  (*glad_glClearColor)(1.0,1.0,1.0,0.0);
  populateDefaultShadersAndRules(in_stack_00004160);
  return;
}

Assistant:

void GLEngine::initialize() {
  // Small callback function for GLFW errors
  auto error_print_callback = [](int error, const char* description) {
    if (polyscope::options::verbosity > 0) {
      std::cout << "GLFW emitted error: " << description << std::endl;
    }
  };

  // === Initialize glfw
  glfwSetErrorCallback(error_print_callback);
  if (!glfwInit()) {
    exception(options::printPrefix + "ERROR: Failed to initialize glfw");
  }

  // OpenGL version things
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#if __APPLE__
  glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif

  // Create the window with context
  glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);
  glfwWindowHint(GLFW_FOCUS_ON_SHOW, GLFW_FALSE);
  mainWindow = glfwCreateWindow(view::windowWidth, view::windowHeight, options::programName.c_str(), NULL, NULL);
  glfwMakeContextCurrent(mainWindow);
  glfwSetWindowPos(mainWindow, view::initWindowPosX, view::initWindowPosY);

  // Set initial window size
  int newBufferWidth, newBufferHeight, newWindowWidth, newWindowHeight;
  glfwGetFramebufferSize(mainWindow, &newBufferWidth, &newBufferHeight);
  glfwGetWindowSize(mainWindow, &newWindowWidth, &newWindowHeight);
  view::bufferWidth = newBufferWidth;
  view::bufferHeight = newBufferHeight;
  view::windowWidth = newWindowWidth;
  view::windowHeight = newWindowHeight;

  setWindowResizable(view::windowResizable);

// === Initialize openGL
// Load openGL functions (using GLAD)
#ifndef __APPLE__
  if (!gladLoadGL()) {
    exception(options::printPrefix + "ERROR: Failed to load openGL using GLAD");
  }
#endif
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "Backend: openGL3_glfw -- "
              << "Loaded openGL version: " << glGetString(GL_VERSION) << std::endl;
  }

#ifdef __APPLE__
  // Hack to classify the process as interactive
  glfwPollEvents();
#endif

  { // Manually create the screen frame buffer
    GLFrameBuffer* glScreenBuffer = new GLFrameBuffer(view::bufferWidth, view::bufferHeight, true);
    displayBuffer.reset(glScreenBuffer);
    glScreenBuffer->bind();
    glClearColor(1., 1., 1., 0.);
    // glClearColor(0., 0., 0., 0.);
    // glClearDepth(1.);
  }

  populateDefaultShadersAndRules();
}